

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

ReferenceType * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
          (Db *this,Node **args,ReferenceKind *args_1)

{
  ReferenceType *this_00;
  ReferenceKind *args_local_1;
  Node **args_local;
  Db *this_local;
  
  this_00 = (ReferenceType *)
            anon_unknown.dwarf_4161a3::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  anon_unknown.dwarf_4161a3::ReferenceType::ReferenceType(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }